

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c74_mock_outlets.h
# Opt level: O1

void __thiscall c74::max::t_mock_outlet::push(t_mock_outlet *this,t_atom_long value)

{
  pointer ptVar1;
  t_symbol *ptVar2;
  t_atom_vector av;
  vector<c74::max::t_atom,_std::allocator<c74::max::t_atom>_> local_38;
  
  local_38.super__Vector_base<c74::max::t_atom,_std::allocator<c74::max::t_atom>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<c74::max::t_atom,_std::allocator<c74::max::t_atom>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.super__Vector_base<c74::max::t_atom,_std::allocator<c74::max::t_atom>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<c74::max::t_atom,_std::allocator<c74::max::t_atom>_>::resize(&local_38,2);
  ptVar1 = local_38.super__Vector_base<c74::max::t_atom,_std::allocator<c74::max::t_atom>_>._M_impl.
           super__Vector_impl_data._M_start;
  ptVar2 = gensym("int");
  (ptVar1->a_w).w_sym = ptVar2;
  ptVar1->a_type = 3;
  local_38.super__Vector_base<c74::max::t_atom,_std::allocator<c74::max::t_atom>_>._M_impl.
  super__Vector_impl_data._M_start[1].a_w.w_long = value;
  local_38.super__Vector_base<c74::max::t_atom,_std::allocator<c74::max::t_atom>_>._M_impl.
  super__Vector_impl_data._M_start[1].a_type = 1;
  std::
  vector<std::vector<c74::max::t_atom,_std::allocator<c74::max::t_atom>_>,_std::allocator<std::vector<c74::max::t_atom,_std::allocator<c74::max::t_atom>_>_>_>
  ::push_back(&this->m_messages,&local_38);
  if (local_38.super__Vector_base<c74::max::t_atom,_std::allocator<c74::max::t_atom>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<c74::max::t_atom,_std::allocator<c74::max::t_atom>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.
                          super__Vector_base<c74::max::t_atom,_std::allocator<c74::max::t_atom>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.
                          super__Vector_base<c74::max::t_atom,_std::allocator<c74::max::t_atom>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void push(t_atom_long value)
    {
        t_atom_vector av;

        av.resize(2);
        atom_setsym(&av[0], gensym("int"));
        atom_setlong(&av[1], value);
        m_messages.push_back(av);
    }